

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set.hpp
# Opt level: O0

iterator * __thiscall
ft::multiset<int,_ft::less<int>,_ft::allocator<int>_>::insert
          (iterator *__return_storage_ptr__,multiset<int,_ft::less<int>,_ft::allocator<int>_> *this,
          iterator *position,value_type *val)

{
  node *x;
  bool bVar1;
  reference pvVar2;
  treeNode<int> *ptVar3;
  node *pnVar4;
  bool local_132;
  bool local_102;
  less<int> local_c1;
  iterator local_c0;
  undefined1 local_a8 [8];
  iterator tmp_1;
  iterator local_88;
  undefined1 local_70 [8];
  iterator tmp;
  iterator local_48;
  node *local_30;
  node *ret;
  value_type *val_local;
  iterator *position_local;
  multiset<int,_ft::less<int>,_ft::allocator<int>_> *this_local;
  
  ret = (node *)val;
  val_local = (value_type *)position;
  position_local = (iterator *)this;
  this_local = (multiset<int,_ft::less<int>,_ft::allocator<int>_> *)__return_storage_ptr__;
  bVar1 = treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::empty
                    ((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this);
  if (bVar1) {
    pnVar4 = treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::root
                       ((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this);
    local_30 = BSTinsert(this,pnVar4,&ret->value);
  }
  else {
    treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end
              (&local_48,(treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this);
    bVar1 = operator==(position,&local_48);
    treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_48);
    if (bVar1) {
      treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator--(position);
      setBase<int,_ft::less<int>,_ft::allocator<int>_>::key_comp
                (&this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>);
      pvVar2 = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*(position);
      bVar1 = less<int>::operator()((less<int> *)((long)&tmp.m_node + 3),pvVar2,&ret->value);
      if (bVar1) {
        ptVar3 = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::node(position);
        local_30 = BSTinsert(this,ptVar3,&ret->value);
      }
      else {
        pnVar4 = treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::root
                           ((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this);
        local_30 = BSTinsert(this,pnVar4,&ret->value);
      }
    }
    else {
      setBase<int,_ft::less<int>,_ft::allocator<int>_>::key_comp
                (&this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>);
      pvVar2 = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*(position);
      bVar1 = less<int>::operator()((less<int> *)((long)&tmp.m_node + 1),pvVar2,&ret->value);
      if (bVar1) {
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
                  ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_70,position);
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
                  ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_70);
        treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::end
                  (&local_88,(treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this);
        bVar1 = operator==((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_70,
                           &local_88);
        local_102 = true;
        if (!bVar1) {
          setBase<int,_ft::less<int>,_ft::allocator<int>_>::key_comp
                    (&this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>);
          x = ret;
          pvVar2 = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                             ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_70);
          local_102 = less<int>::operator()((less<int> *)((long)&tmp_1.m_node + 7),&x->value,pvVar2)
          ;
        }
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_88);
        if (local_102 == false) {
          pnVar4 = treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::root
                             ((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this);
          local_30 = BSTinsert(this,pnVar4,&ret->value);
        }
        else {
          ptVar3 = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::node(position);
          local_30 = BSTinsert(this,ptVar3,&ret->value);
        }
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator
                  ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_70);
      }
      else {
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
                  ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_a8,position);
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator--
                  ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_a8);
        treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::begin
                  (&local_c0,(treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this);
        bVar1 = operator==(position,&local_c0);
        local_132 = true;
        if (!bVar1) {
          setBase<int,_ft::less<int>,_ft::allocator<int>_>::key_comp
                    (&this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>);
          pvVar2 = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator*
                             ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_a8);
          local_132 = less<int>::operator()(&local_c1,pvVar2,&ret->value);
        }
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator(&local_c0);
        if (local_132 == false) {
          pnVar4 = treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::root
                             ((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this);
          local_30 = BSTinsert(this,pnVar4,&ret->value);
        }
        else {
          ptVar3 = treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::node(position);
          local_30 = BSTinsert(this,ptVar3,&ret->value);
        }
        treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::~treeIterator
                  ((treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *)local_a8);
      }
    }
  }
  treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>::fixInsertViolation
            ((treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_> *)this,local_30);
  (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
  super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size =
       (this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
       super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_size + 1;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::treeIterator
            (__return_storage_ptr__,
             &(this->super_setBase<int,_ft::less<int>,_ft::allocator<int>_>).
              super_treeBase<int,_int,_int,_ft::less<int>,_ft::allocator<int>_>.m_tree,local_30);
  return __return_storage_ptr__;
}

Assistant:

iterator	insert(iterator position, value_type const & val) {
		node*	ret;

		if (this->empty())
			ret = this->BSTinsert(this->root(), val);
		else if (position == this->end()) {
			--position;
			if (this->key_comp()(*position, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else if (this->key_comp()(*position, val)) {
			iterator	tmp(position);
			++tmp;
			if (tmp == this->end() || this->key_comp()(val, *tmp))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		else {
			iterator	tmp(position);
			--tmp;
			if (position == this->begin() || this->key_comp()(*tmp, val))
				ret = this->BSTinsert(position.node(), val);
			else
				ret = this->BSTinsert(this->root(), val);
		}
		this->fixInsertViolation(ret);
		++this->m_size;
		return iterator(this->m_tree, ret);
	}